

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPipes.cxx
# Opt level: O2

int cmGetPipes(int *fds)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = pipe(fds);
  if (iVar1 != -1) {
    iVar1 = fcntl(*fds,2,1);
    if (iVar1 != -1) {
      iVar1 = fcntl(fds[1],2,1);
      if (iVar1 != -1) {
        return 0;
      }
    }
    close(*fds);
    close(fds[1]);
  }
  piVar2 = __errno_location();
  iVar1 = uv_translate_sys_error(*piVar2);
  return iVar1;
}

Assistant:

int cmGetPipes(int* fds)
{
  if (pipe(fds) == -1) {
    return uv_translate_sys_error(errno);
  }

  if (fcntl(fds[0], F_SETFD, FD_CLOEXEC) == -1 ||
      fcntl(fds[1], F_SETFD, FD_CLOEXEC) == -1) {
    close(fds[0]);
    close(fds[1]);
    return uv_translate_sys_error(errno);
  }
  return 0;
}